

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void check_call_unroll(jit_State *J,TraceNo lnk)

{
  TValue *pTVar1;
  uint64_t uVar2;
  long lVar3;
  void *local_38;
  int local_30;
  int local_2c;
  int32_t count;
  int32_t depth;
  void *pc;
  cTValue *frame;
  TraceNo lnk_local;
  jit_State *J_local;
  
  pTVar1 = J->L->base;
  pc = pTVar1 + -1;
  local_2c = J->framedepth;
  local_30 = 0;
  if ((J->pt->flags & 2) != 0) {
    local_2c = local_2c + -1;
  }
  for (; 0 < local_2c; local_2c = local_2c + -1) {
    if ((*pc & 7) == 2) {
      local_2c = local_2c + -1;
    }
    if ((*pc & 3) == 0) {
      lVar3 = (ulong)((*(uint *)(*pc + -4) >> 8 & 0xff) + 2) * -8;
    }
    else {
      lVar3 = -(*pc & 0xfffffffffffffff8);
    }
    local_38 = (void *)((long)pc + lVar3);
    pc = local_38;
    if (*(long *)((*(ulong *)((long)local_38 + -8) & 0x7fffffffffff) + 0x20) ==
        *(long *)((pTVar1[-2].u64 & 0x7fffffffffff) + 0x20)) {
      local_30 = local_30 + 1;
    }
  }
  if (J->pc == J->startpc) {
    if (J->param[0xc] < local_30 + J->tailcalled) {
      J->pc = J->pc + 1;
      if (J->framedepth + J->retdepth == 0) {
        lj_record_stop(J,LJ_TRLINK_TAILREC,(uint)(J->cur).traceno);
      }
      else {
        lj_record_stop(J,LJ_TRLINK_UPREC,(uint)(J->cur).traceno);
      }
    }
  }
  else if (J->param[0xb] < local_30) {
    if (lnk != 0) {
      lj_trace_flush(J,lnk);
      uVar2 = lj_prng_u64(&J->prng);
      *(ushort *)((long)&J[1].cur.nextgc.gcptr64 + (ulong)((int)J->pc + 4U >> 2 & 0x3f) * 2) =
           (ushort)uVar2 & 0xf;
    }
    lj_trace_err(J,LJ_TRERR_CUNROLL);
  }
  return;
}

Assistant:

static void check_call_unroll(jit_State *J, TraceNo lnk)
{
  cTValue *frame = J->L->base - 1;
  void *pc = mref(frame_func(frame)->l.pc, void);
  int32_t depth = J->framedepth;
  int32_t count = 0;
  if ((J->pt->flags & PROTO_VARARG)) depth--;  /* Vararg frame still missing. */
  for (; depth > 0; depth--) {  /* Count frames with same prototype. */
    if (frame_iscont(frame)) depth--;
    frame = frame_prev(frame);
    if (mref(frame_func(frame)->l.pc, void) == pc)
      count++;
  }
  if (J->pc == J->startpc) {
    if (count + J->tailcalled > J->param[JIT_P_recunroll]) {
      J->pc++;
      if (J->framedepth + J->retdepth == 0)
	lj_record_stop(J, LJ_TRLINK_TAILREC, J->cur.traceno);  /* Tail-rec. */
      else
	lj_record_stop(J, LJ_TRLINK_UPREC, J->cur.traceno);  /* Up-recursion. */
    }
  } else {
    if (count > J->param[JIT_P_callunroll]) {
      if (lnk) {  /* Possible tail- or up-recursion. */
	lj_trace_flush(J, lnk);  /* Flush trace that only returns. */
	/* Set a small, pseudo-random hotcount for a quick retry of JFUNC*. */
	hotcount_set(J2GG(J), J->pc+1, lj_prng_u64(&J->prng) & 15u);
      }
      lj_trace_err(J, LJ_TRERR_CUNROLL);
    }
  }
}